

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O3

int rs_restore_file(FILE *inf)

{
  int iVar1;
  pointer pAVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  _Self __tmp;
  int *piVar6;
  MonsterThing *pMVar7;
  _List_node_base *p_Var8;
  ItemThing *pIVar9;
  daemon_function_t p_Var10;
  byte bVar11;
  list<MonsterThing_*,_std::allocator<MonsterThing_*>_> *plVar12;
  ItemThing **item;
  ItemThing **item_00;
  ItemThing **item_01;
  ItemThing **item_02;
  ItemThing **item_03;
  ItemThing **item_04;
  uint uVar13;
  uint y;
  char **master;
  char *pcVar14;
  uint x;
  long lVar15;
  size_type __new_size;
  bool bVar16;
  int value;
  int value_2;
  int value_3;
  uint local_3c;
  uint local_38;
  int local_34;
  
  bVar4 = format_error | read_error;
  if ((bVar4 & 1) == 0) {
    rs_read_boolean(inf,&after);
    rs_read_boolean(inf,&again);
    rs_read_boolean(inf,&seenstairs);
    rs_read_boolean(inf,&amulet);
    rs_read_boolean(inf,&door_stop);
    rs_read_boolean(inf,&fight_flush);
    rs_read_boolean(inf,&firstmove);
    rs_read_boolean(inf,&has_hit);
    rs_read_boolean(inf,&inv_describe);
    rs_read_boolean(inf,&jump);
    rs_read_boolean(inf,&kamikaze);
    rs_read_boolean(inf,&lower_msg);
    rs_read_boolean(inf,&move_on);
    rs_read_boolean(inf,&passgo);
    rs_read_boolean(inf,&playing);
    rs_read_boolean(inf,&running);
    rs_read_boolean(inf,&save_msg);
    rs_read_boolean(inf,&terse);
    rs_read_boolean(inf,&to_death);
    local_3c = 0;
    if ((read_error == 0) && ((format_error & 1) == 0)) {
      rs_read_int(inf,(int *)&local_3c);
      if (local_3c != 0x1a) {
        format_error = 1;
      }
      lVar15 = 0;
      do {
        iVar5 = rs_read_boolean(inf,pack_used + lVar15);
        if (iVar5 != 0) break;
        bVar16 = lVar15 != 0x19;
        lVar15 = lVar15 + 1;
      } while (bVar16);
    }
    rs_read_int(inf,&dir_ch);
    rs_read_chars(inf,file_name,0x400);
    rs_read_chars(inf,huh,0x400);
    if ((read_error == 0) && ((format_error & 1) == 0)) {
      lVar15 = 0;
      do {
        rs_read_string_index(inf,rainbow,cNCOLORS,(char **)((long)p_colors + lVar15));
        lVar15 = lVar15 + 8;
      } while (lVar15 != 0x70);
    }
    rs_read_chars(inf,prbuf,0x800);
    if ((read_error == 0) && ((format_error & 1) == 0)) {
      bVar11 = 0;
      bVar4 = 0;
      lVar15 = 0;
      iVar5 = cNSTONES;
      do {
        local_3c = 0;
        if (((bVar4 & 1) == 0) && ((bVar11 & 1) == 0)) {
          rs_read_int(inf,(int *)&local_3c);
          bVar11 = format_error;
          bVar4 = read_error;
          iVar1 = cNSTONES;
          if (iVar5 < (int)local_3c) {
            format_error = 1;
            bVar11 = 1;
            iVar5 = iVar1;
          }
          else if ((int)local_3c < 0) {
            r_stones[lVar15] = (char *)0x0;
            iVar5 = iVar1;
          }
          else {
            r_stones[lVar15] = stones[local_3c].st_name;
            iVar5 = iVar1;
          }
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != 0xe);
    }
    rs_read_int(inf,&runch);
    if ((read_error == 0) && ((format_error & 1) == 0)) {
      lVar15 = 0;
      do {
        rs_read_new_string(inf,(char **)((long)s_names + lVar15));
        lVar15 = lVar15 + 8;
      } while (lVar15 != 0x98);
    }
    rs_read_char(inf,&take);
    local_3c = 0;
    if ((read_error == 0) && ((format_error & 1) == 0)) {
      lVar15 = 0;
      do {
        rs_read_int(inf,(int *)&local_3c);
        bVar16 = local_3c == 0;
        master = metal;
        if (bVar16) {
          master = wood;
        }
        pcVar14 = "wand";
        if (bVar16) {
          pcVar14 = "staff";
        }
        piVar6 = &cNMETAL;
        if (bVar16) {
          piVar6 = &cNWOOD;
        }
        rs_read_string_index(inf,master,*piVar6,(char **)((long)ws_made + lVar15));
        *(char **)((long)ws_type + lVar15) = pcVar14;
        lVar15 = lVar15 + 8;
      } while (lVar15 != 0x70);
    }
    rs_read_int(inf,&l_last_comm);
    rs_read_int(inf,&l_last_dir);
    rs_read_int(inf,&last_comm);
    rs_read_int(inf,&last_dir);
    rs_read_int(inf,&n_objs);
    rs_read_int(inf,&hungry_state);
    rs_read_int(inf,&inv_type);
    rs_read_int(inf,&level);
    rs_read_int(inf,&max_level);
    rs_read_int(inf,&no_food);
    rs_read_ints(inf,a_class,8);
    rs_read_int(inf,&count);
    rs_read_int(inf,&food_left);
    rs_read_int(inf,&lastscore);
    rs_read_int(inf,&no_command);
    rs_read_int(inf,&no_move);
    rs_read_int(inf,&purse);
    rs_read_int(inf,&quiet);
    rs_read_int(inf,&vf_hit);
    rs_read_int(inf,&dnum);
    rs_read_ints(inf,e_levels,0x15);
    rs_read_coord(inf,&delta);
    rs_read_coord(inf,&oldpos);
    rs_read_coord(inf,&stairs);
    rs_read_thing(inf,&player);
    rs_read_object_reference(inf,(list<ItemThing_*,_std::allocator<ItemThing_*>_> *)&cur_armor,item)
    ;
    rs_read_object_reference
              (inf,(list<ItemThing_*,_std::allocator<ItemThing_*>_> *)cur_ring,item_00);
    rs_read_object_reference
              (inf,(list<ItemThing_*,_std::allocator<ItemThing_*>_> *)(cur_ring + 1),item_01);
    rs_read_object_reference
              (inf,(list<ItemThing_*,_std::allocator<ItemThing_*>_> *)&cur_weapon,item_02);
    rs_read_object_reference
              (inf,(list<ItemThing_*,_std::allocator<ItemThing_*>_> *)&l_last_pick,item_03);
    rs_read_object_reference
              (inf,(list<ItemThing_*,_std::allocator<ItemThing_*>_> *)&last_pick,item_04);
    rs_read_object_list(inf,&lvl_obj_abi_cxx11_);
    if ((read_error == 0) && ((format_error & 1) == 0)) {
      rs_read_marker(inf,-0x5432fff7);
      rs_read_int(inf,(int *)&local_3c);
      uVar13 = local_3c;
      if (0 < (int)local_3c) {
        do {
          pMVar7 = (MonsterThing *)operator_new(0x68);
          MonsterThing::MonsterThing(pMVar7);
          p_Var8 = (_List_node_base *)operator_new(0x18);
          p_Var8[1]._M_next = (_List_node_base *)pMVar7;
          std::__detail::_List_node_base::_M_hook(p_Var8,(_List_node_base *)&mlist_abi_cxx11_);
          mlist_abi_cxx11_.super__List_base<MonsterThing_*,_std::allocator<MonsterThing_*>_>._M_impl
          ._M_node._M_size =
               mlist_abi_cxx11_.super__List_base<MonsterThing_*,_std::allocator<MonsterThing_*>_>.
               _M_impl._M_node._M_size + 1;
          rs_read_thing(inf,pMVar7);
          uVar13 = uVar13 - 1;
        } while (uVar13 != 0);
      }
    }
    p_Var8 = mlist_abi_cxx11_.super__List_base<MonsterThing_*,_std::allocator<MonsterThing_*>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    if (-1 < player.reserved) {
      iVar5 = player.reserved + 1;
      plVar12 = &mlist_abi_cxx11_;
      do {
        plVar12 = (list<MonsterThing_*,_std::allocator<MonsterThing_*>_> *)
                  (((_List_base<MonsterThing_*,_std::allocator<MonsterThing_*>_> *)
                   &((_List_node_base *)plVar12)->_M_next)->_M_impl)._M_node.super__List_node_base.
                  _M_next;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      if (*(coord **)((long)plVar12 + 0x10) != (coord *)0x0) {
        player.dest = *(coord **)((long)plVar12 + 0x10);
      }
    }
    for (; p_Var8 != (_List_node_base *)&mlist_abi_cxx11_;
        p_Var8 = (((_List_base<MonsterThing_*,_std::allocator<MonsterThing_*>_> *)&p_Var8->_M_next)
                 ->_M_impl)._M_node.super__List_node_base._M_next) {
      iVar5 = *(int *)&p_Var8[1]._M_next[6]._M_next;
      if (-1 < iVar5) {
        iVar5 = iVar5 + 1;
        plVar12 = &mlist_abi_cxx11_;
        do {
          plVar12 = (list<MonsterThing_*,_std::allocator<MonsterThing_*>_> *)
                    (((_List_base<MonsterThing_*,_std::allocator<MonsterThing_*>_> *)
                     &((_List_node_base *)plVar12)->_M_next)->_M_impl)._M_node.super__List_node_base
                    ._M_next;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
        if (*(_List_node_base **)((long)plVar12 + 0x10) != (_List_node_base *)0x0) {
          p_Var8[1]._M_next[1]._M_next = *(_List_node_base **)((long)plVar12 + 0x10);
        }
      }
    }
    if ((read_error == 0) && ((format_error & 1) == 0)) {
      lVar15 = 0;
      do {
        rs_read_char(inf,&places[lVar15].p_ch);
        rs_read_int(inf,&places[lVar15].p_flags);
        if (((format_error | read_error) & 1) == 0) {
          rs_read_int(inf,(int *)&local_3c);
          if (local_3c == 0xffffffff) {
            pMVar7 = (MonsterThing *)0x0;
          }
          else {
            p_Var8 = mlist_abi_cxx11_.
                     super__List_base<MonsterThing_*,_std::allocator<MonsterThing_*>_>._M_impl.
                     _M_node.super__List_node_base._M_next;
            if (0 < (int)local_3c) {
              uVar13 = local_3c + 1;
              do {
                p_Var8 = p_Var8->_M_next;
                uVar13 = uVar13 - 1;
              } while (1 < uVar13);
            }
            pMVar7 = (MonsterThing *)p_Var8[1]._M_next;
          }
          places[lVar15].p_monst = pMVar7;
        }
        if (((read_error & 1) == 0) && ((format_error & 1) == 0)) {
          rs_read_int(inf,(int *)&local_3c);
          if (local_3c == 0xffffffff) {
            pIVar9 = (ItemThing *)0x0;
          }
          else {
            p_Var8 = lvl_obj_abi_cxx11_.super__List_base<ItemThing_*,_std::allocator<ItemThing_*>_>.
                     _M_impl._M_node.super__List_node_base._M_next;
            if (0 < (int)local_3c) {
              uVar13 = local_3c + 1;
              do {
                p_Var8 = p_Var8->_M_next;
                uVar13 = uVar13 - 1;
              } while (1 < uVar13);
            }
            pIVar9 = (ItemThing *)p_Var8[1]._M_next;
          }
          places[lVar15].p_item = pIVar9;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != 0xa00);
    }
    rs_read_stats(inf,&max_stats);
    local_3c = 0;
    bVar4 = read_error;
    bVar11 = format_error;
    if (((format_error | read_error) & 1) == 0) {
      rs_read_int(inf,(int *)&local_3c);
      uVar13 = local_3c;
      __new_size = (size_type)(int)local_3c;
      if ((long)__new_size < 0) {
        format_error = 1;
      }
      std::vector<Area,_std::allocator<Area>_>::resize(&areas,__new_size);
      bVar4 = read_error;
      bVar11 = format_error;
      if (0 < (int)uVar13) {
        lVar15 = 0;
        do {
          pAVar2 = areas.super__Vector_base<Area,_std::allocator<Area>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (((bVar4 | bVar11) & 1) == 0) {
            rs_read_coord(inf,(coord *)((long)&((areas.
                                                 super__Vector_base<Area,_std::allocator<Area>_>.
                                                 _M_impl.super__Vector_impl_data._M_start)->position
                                               ).x + lVar15));
            rs_read_coord(inf,(coord *)((long)&(pAVar2->size).x + lVar15));
            rs_read_int(inf,(int *)((long)&pAVar2->flags + lVar15));
            bVar4 = read_error;
            bVar11 = format_error;
          }
          lVar15 = lVar15 + 0x14;
        } while (__new_size * 0x14 != lVar15);
      }
    }
    local_3c = 0;
    if (((bVar11 | bVar4) & 1) == 0) {
      rs_read_marker(inf,-0x5432fff5);
      rs_read_int(inf,(int *)&local_3c);
      if (local_3c != 0x1a) {
        format_error = 1;
      }
      lVar15 = 0x10;
      do {
        rs_read_stats(inf,(stats *)(monsters[0].m_stats.s_dmg + lVar15 + -0x24));
        lVar15 = lVar15 + 0x38;
      } while (lVar15 != 0x5c0);
    }
    rs_read_obj_info(inf,things,7);
    rs_read_obj_info(inf,food_info,7);
    rs_read_obj_info(inf,arm_info,8);
    rs_read_obj_info(inf,pot_info,0xe);
    rs_read_obj_info(inf,ring_info,0xe);
    rs_read_obj_info(inf,scr_info,0x13);
    rs_read_obj_info(inf,weap_info,10);
    rs_read_obj_info(inf,ws_info,0xe);
    local_38 = 0;
    if ((read_error == 0) && ((format_error & 1) == 0)) {
      rs_read_marker(inf,-0x5432fff2);
      rs_read_int(inf,(int *)&local_38);
      if (0x14 < (int)local_38) {
        format_error = 1;
      }
      piVar6 = &d_list[0].d_arg;
      lVar15 = 0x14;
      do {
        local_3c = 0;
        rs_read_int(inf,(int *)(piVar6 + -4));
        rs_read_int(inf,(int *)&local_3c);
        rs_read_int(inf,piVar6);
        rs_read_int(inf,piVar6 + 1);
        if (local_3c - 1 < 9) {
          p_Var10 = (daemon_function_t)(&PTR_rollwand_0015cba0)[local_3c - 1];
        }
        else {
          p_Var10 = (daemon_function_t)0x0;
        }
        *(daemon_function_t *)(piVar6 + -2) = p_Var10;
        piVar6 = piVar6 + 6;
        lVar15 = lVar15 + -1;
      } while (lVar15 != 0);
      if (prname::tbuf._8_8_ == 0) {
        prname::tbuf[0] = '\0';
        prname::tbuf[1] = '\0';
        prname::tbuf[2] = '\0';
        prname::tbuf[3] = '\0';
        prname::tbuf[0x10] = '\0';
        prname::tbuf[0x11] = '\0';
        prname::tbuf[0x12] = '\0';
        prname::tbuf[0x13] = '\0';
        prname::tbuf[0x14] = '\0';
        prname::tbuf[0x15] = '\0';
        prname::tbuf[0x16] = '\0';
        prname::tbuf[0x17] = '\0';
      }
    }
    rs_read_int(inf,&between);
    rs_read_int(inf,&group);
    if ((read_error == 0) && ((format_error & 1) == 0)) {
      rs_read_marker(inf,-0x5432fff3);
      rs_read_int(inf,(int *)&local_3c);
      rs_read_int(inf,(int *)&local_38);
      uVar3 = local_38;
      uVar13 = local_3c;
      if (0 < (int)local_3c) {
        y = 0;
        do {
          if (0 < (int)uVar3) {
            x = 0;
            do {
              iVar5 = rs_read_int(inf,&local_34);
              if (iVar5 != 0) goto LAB_001248dd;
              if (x < 0x50 && y < 0x20) {
                setMapDisplay(x,y,local_34);
              }
              x = x + 1;
            } while (uVar3 != x);
          }
          y = y + 1;
        } while (y != uVar13);
      }
    }
LAB_001248dd:
    bVar4 = read_error | format_error;
  }
  return bVar4 & 1;
}

Assistant:

int rs_restore_file(FILE *inf)
{
    if (read_error || format_error)
        return(READSTAT);

    rs_read_boolean(inf, &after);               /* 1  */    /* extern.c */
    rs_read_boolean(inf, &again);               /* 2  */
    rs_read_boolean(inf, &seenstairs);          /* 4  */
    rs_read_boolean(inf, &amulet);              /* 5  */
    rs_read_boolean(inf, &door_stop);           /* 6  */
    rs_read_boolean(inf, &fight_flush);         /* 7  */
    rs_read_boolean(inf, &firstmove);           /* 8  */
    rs_read_boolean(inf, &has_hit);             /* 10 */
    rs_read_boolean(inf, &inv_describe);        /* 12 */
    rs_read_boolean(inf, &jump);                /* 13 */
    rs_read_boolean(inf, &kamikaze);            /* 14 */
    rs_read_boolean(inf, &lower_msg);           /* 15 */
    rs_read_boolean(inf, &move_on);             /* 16 */
    rs_read_boolean(inf, &passgo);              /* 18 */
    rs_read_boolean(inf, &playing);             /* 19 */
    rs_read_boolean(inf, &running);             /* 21 */
    rs_read_boolean(inf, &save_msg);            /* 22 */
    rs_read_boolean(inf, &terse);               /* 25 */
    rs_read_boolean(inf, &to_death);            /* 26 */
    rs_read_booleans(inf, pack_used, 26);       /* 29 */
    rs_read_int(inf, &dir_ch);
    rs_read_chars(inf, file_name, MAXSTR);
    rs_read_chars(inf, huh, MAXSTR);
    rs_read_potions(inf);
    rs_read_chars(inf, prbuf, 2*MAXSTR);
    rs_read_rings(inf);
    rs_read_int(inf, &runch);
    rs_read_scrolls(inf);
    rs_read_char(inf, &take);
    rs_read_sticks(inf);
    rs_read_int(inf, &l_last_comm);
    rs_read_int(inf, &l_last_dir);
    rs_read_int(inf, &last_comm);
    rs_read_int(inf, &last_dir);
    rs_read_int(inf, &n_objs);
    rs_read_int(inf, &hungry_state);
    rs_read_int(inf, &inv_type);
    rs_read_int(inf, &level);
    rs_read_int(inf, &max_level);
    rs_read_int(inf, &no_food);
    rs_read_ints(inf,a_class,MAXARMORS);
    rs_read_int(inf, &count);
    rs_read_int(inf, &food_left);
    rs_read_int(inf, &lastscore);
    rs_read_int(inf, &no_command);
    rs_read_int(inf, &no_move);
    rs_read_int(inf, &purse);
    rs_read_int(inf, &quiet);
    rs_read_int(inf, &vf_hit);
    rs_read_int(inf, &dnum);
    rs_read_ints(inf,e_levels,21);
    rs_read_coord(inf, &delta);
    rs_read_coord(inf, &oldpos);
    rs_read_coord(inf, &stairs);

    rs_read_thing(inf, &player); 
    rs_read_object_reference(inf, player.pack, &cur_armor);
    rs_read_object_reference(inf, player.pack, &cur_ring[0]);
    rs_read_object_reference(inf, player.pack, &cur_ring[1]);
    rs_read_object_reference(inf, player.pack, &cur_weapon);
    rs_read_object_reference(inf, player.pack, &l_last_pick);
    rs_read_object_reference(inf, player.pack, &last_pick);

    rs_read_object_list(inf, lvl_obj);
    rs_read_monster_list(inf);                  
    rs_fix_monster(&player);
    rs_fix_monster_list();

    rs_read_places(inf,places,MAXLINES*MAXCOLS);

    rs_read_stats(inf, &max_stats);
    rs_read_areas(inf);

    rs_read_monsters(inf,monsters,26);                  
    rs_read_obj_info(inf, things,   NUMITEMTYPES);         
    rs_read_obj_info(inf, food_info, MAXFOODS);  
    rs_read_obj_info(inf, arm_info,  MAXARMORS);         
    rs_read_obj_info(inf, pot_info,  MAXPOTIONS);       
    rs_read_obj_info(inf, ring_info, MAXRINGS);         
    rs_read_obj_info(inf, scr_info,  MAXSCROLLS);       
    rs_read_obj_info(inf, weap_info, MAXWEAPONS+1);       
    rs_read_obj_info(inf, ws_info,   MAXSTICKS);       

    rs_read_daemons(inf, d_list, 20);                   /* 5.4-daemon.c     */
    rs_read_int(inf,&between);                          /* 5.4-daemons.c    */
    rs_read_int(inf,&group);                            /* 5.4-weapons.c    */
    
    rs_read_window(inf);

    return(READSTAT);
}